

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICache.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_ce12b5::Cache::DumpEntryProperty
          (Value *__return_storage_ptr__,Cache *this,string *name,string *prop)

{
  Value *pVVar1;
  string *psVar2;
  bool local_ba;
  allocator<char> local_b9;
  String local_b8;
  Value local_98;
  cmValue local_70;
  cmValue p;
  Value local_58;
  undefined1 local_29;
  String *local_28;
  string *prop_local;
  string *name_local;
  Cache *this_local;
  Value *property;
  
  local_29 = 0;
  local_28 = prop;
  prop_local = name;
  name_local = (string *)this;
  this_local = (Cache *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_58,local_28);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(pVVar1,&local_58);
  Json::Value::~Value(&local_58);
  local_70 = cmState::GetCacheEntryProperty(this->State,prop_local,local_28);
  local_ba = cmValue::operator_cast_to_bool(&local_70);
  if (local_ba) {
    psVar2 = cmValue::operator*[abi_cxx11_(&local_70);
    std::__cxx11::string::string((string *)&local_b8,(string *)psVar2);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"",&local_b9);
  }
  local_ba = !local_ba;
  Json::Value::Value(&local_98,&local_b8);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"value");
  Json::Value::operator=(pVVar1,&local_98);
  Json::Value::~Value(&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  if (local_ba) {
    std::allocator<char>::~allocator(&local_b9);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Cache::DumpEntryProperty(std::string const& name,
                                     std::string const& prop)
{
  Json::Value property = Json::objectValue;
  property["name"] = prop;
  cmValue p = this->State->GetCacheEntryProperty(name, prop);
  property["value"] = p ? *p : "";
  return property;
}